

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtaskqueue.h
# Opt level: O1

bool __thiscall
TaskQueue<std::shared_ptr<VRleTask>_>::try_pop
          (TaskQueue<std::shared_ptr<VRleTask>_> *this,shared_ptr<VRleTask> *task)

{
  _Elt_pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  bool bVar5;
  lock_t lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->_mutex;
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)local_20._M_device);
  local_20._M_owns = iVar4 == 0;
  if ((local_20._M_owns) &&
     (psVar1 = (this->_q).
               super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (this->_q).
     super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>.
     _M_impl.super__Deque_impl_data._M_finish._M_cur != psVar1)) {
    peVar2 = (psVar1->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var3 = (psVar1->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (psVar1->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (psVar1->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (task->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (task->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
    (task->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>::pop_front
              (&this->_q);
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if (local_20._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_20);
  }
  return bVar5;
}

Assistant:

bool try_pop(Task &task)
    {
        lock_t lock{_mutex, std::try_to_lock};
        if (!lock || _q.empty()) return false;
        task = std::move(_q.front());
        _q.pop_front();
        return true;
    }